

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

int __thiscall crnlib::dynamic_string::tolower(dynamic_string *this,int __c)

{
  char *p;
  dynamic_string *this_local;
  
  if (this->m_len != 0) {
    p = get_ptr_priv(this);
    strlwr(p);
  }
  return (int)this;
}

Assistant:

dynamic_string& dynamic_string::tolower()
    {
        if (m_len)
        {
#if defined(CRN_CC_MSVC)
            _strlwr_s(get_ptr_priv(), m_buf_size);
#else
            strlwr(get_ptr_priv());
#endif
        }
        return *this;
    }